

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void check_unknown_types<void*>(void **value,char *types,char *param_3)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  char *in_RSI;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  char *message;
  char c;
  int i;
  char *special;
  char format_str [256];
  char (*in_stack_fffffffffffffdd8) [256];
  AssertHelper *in_stack_fffffffffffffde0;
  int line;
  char *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  Type in_stack_fffffffffffffe0c;
  AssertionResult *in_stack_fffffffffffffe10;
  char (*in_stack_fffffffffffffe18) [256];
  Message *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  string local_198 [35];
  byte local_175;
  AssertionResult local_140;
  char *local_130;
  char local_125;
  int local_124;
  char *local_120;
  char local_118 [264];
  char *local_10;
  
  local_120 = ".0123456789}";
  local_124 = -0x80;
  local_10 = in_RSI;
  do {
    if (0x7f < local_124) {
      return;
    }
    local_125 = (char)local_124;
    pcVar2 = strchr(local_10,(int)local_125);
    if (((pcVar2 == (char *)0x0) &&
        (pcVar2 = strchr(local_120,(int)local_125), pcVar2 == (char *)0x0)) && (local_125 != '\0'))
    {
      safe_sprintf<256ul>((char (*) [256])local_118,"{0:10%c}",(ulong)(uint)(int)local_125);
      local_130 = "invalid type specifier";
      testing::AssertionSuccess();
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
      pcVar2 = local_130;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffea0,pcVar2,(allocator *)&stack0xfffffffffffffe9f);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe9f);
        local_175 = 0;
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          fmt::v5::format<char[256],void*>
                    (in_stack_fffffffffffffe18,(void **)in_stack_fffffffffffffe10);
          std::__cxx11::string::~string(local_198);
        }
        if ((local_175 & 1) == 0) {
          testing::AssertionResult::operator<<
                    (in_stack_fffffffffffffe10,
                     (char (*) [107])CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          in_stack_fffffffffffffe64 = 5;
        }
        else {
          in_stack_fffffffffffffe64 = 0;
        }
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
        if (in_stack_fffffffffffffe64 != 0) goto LAB_00199225;
      }
      else {
LAB_00199225:
        testing::Message::Message((Message *)in_stack_fffffffffffffe10);
        pMVar3 = testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        line = (int)((ulong)pMVar3 >> 0x20);
        pMVar3 = testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffde0,
                            (char (*) [2])in_stack_fffffffffffffdd8);
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffde0,(char **)in_stack_fffffffffffffdd8);
        in_stack_fffffffffffffde0 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x199288);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                   in_stack_fffffffffffffe00,line,(char *)pMVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe58);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffde0);
        testing::Message::~Message((Message *)0x1992d6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x19933b);
    }
    local_124 = local_124 + 1;
  } while( true );
}

Assistant:

void check_unknown_types(const T &value, const char *types, const char *) {
  char format_str[BUFFER_SIZE];
  const char *special = ".0123456789}";
  for (int i = CHAR_MIN; i <= CHAR_MAX; ++i) {
    char c = static_cast<char>(i);
    if (std::strchr(types, c) || std::strchr(special, c) || !c) continue;
    safe_sprintf(format_str, "{0:10%c}", c);
    const char *message = "invalid type specifier";
    EXPECT_THROW_MSG(format(format_str, value), format_error, message)
      << format_str << " " << message;
  }
}